

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,string *command,string *output,int *retVal,char *dir,cmDuration timeout,
          ostream *ofs,Encoding encoding)

{
  pointer ppcVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  cmsysProcess *cp;
  long lVar5;
  char *pcVar6;
  size_type sVar7;
  ulong uVar8;
  pointer ppcVar9;
  ulong uVar10;
  string *a;
  cmProcessOutput processOutput;
  cmCTestLogWrite local_278 [2];
  string strdata;
  int length;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  char *data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream cmCTestLog_msg;
  string local_50;
  
  cmSystemTools::ParseArguments(&args,command);
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar2 = 0;
    goto LAB_0014529d;
  }
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&argv,((long)args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  for (; args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    _cmCTestLog_msg =
         ((args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  }
  _cmCTestLog_msg = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,"Run command:");
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x407,strdata._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  ppcVar1 = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar9 = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (ppcVar9 != ppcVar1 && (pcVar6 = *ppcVar9, pcVar6 != (char *)0x0)); ppcVar9 = ppcVar9 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg," \"");
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::operator<<(poVar4,"\"");
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x40c,strdata._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&strdata);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x40e,strdata._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_SetTimeout(cp,timeout.__r);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"   Each . represents ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," bytes of output");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<(poVar4,"    ");
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x424,local_278[0].Data,false);
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  uVar8 = 0;
  while( true ) {
    iVar2 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0);
    if (iVar2 == 0) break;
    cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,0);
    for (sVar7 = 0; strdata._M_string_length != sVar7; sVar7 = sVar7 + 1) {
      if (strdata._M_dataplus._M_p[sVar7] == '\0') {
        strdata._M_dataplus._M_p[sVar7] = '\n';
      }
    }
    std::__cxx11::string::append((string *)output);
    lVar5 = -uVar8;
    uVar10 = uVar8 << 10;
    while( true ) {
      uVar8 = uVar8 + 1;
      if (output->_M_string_length <= uVar10) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      std::operator<<((ostream *)&cmCTestLog_msg,".");
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
          0x42f,local_278[0].Data,false);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      if ((lVar5 != 1) && ((uVar8 / 0x32) * -0x32 + 1 == lVar5)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"  Size: ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,(int)((((double)CONCAT44(0x45300000,
                                                            (int)(output->_M_string_length >> 0x20))
                                          - 1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,(int)output->_M_string_length)
                                         - 4503599627370496.0)) * 0.0009765625 + 1.0));
        poVar4 = std::operator<<(poVar4,"K");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        std::operator<<(poVar4,"    ");
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,3,
            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
            ,0x434,local_278[0].Data,false);
        std::__cxx11::string::~string((string *)local_278);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      lVar5 = lVar5 + -1;
      uVar10 = uVar10 + 0x400;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    local_278[0].Data = strdata._M_dataplus._M_p;
    local_278[0].Length = strdata._M_string_length;
    operator<<((ostream *)&cmCTestLog_msg,local_278);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x438,local_278[0].Data,false);
    uVar8 = -lVar5;
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (((&ofs->field_0x20)[(long)ofs->_vptr_basic_ostream[-3]] & 5) == 0) {
      _cmCTestLog_msg = strdata._M_dataplus._M_p;
      operator<<(ofs,(cmCTestLogWrite *)&cmCTestLog_msg);
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,0);
  std::__cxx11::string::~string((string *)&local_50);
  if (strdata._M_string_length != 0) {
    std::__cxx11::string::append((string *)output);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    local_278[0].Data = strdata._M_dataplus._M_p;
    local_278[0].Length = strdata._M_string_length;
    operator<<((ostream *)&cmCTestLog_msg,local_278);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x441,local_278[0].Data,false);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (((&ofs->field_0x20)[(long)ofs->_vptr_basic_ostream[-3]] & 5) == 0) {
      _cmCTestLog_msg = strdata._M_dataplus._M_p;
      operator<<(ofs,(cmCTestLogWrite *)&cmCTestLog_msg);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg," Size of output: ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(int)((((double)CONCAT44(0x45300000,
                                                      (int)(output->_M_string_length >> 0x20)) -
                                    1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)output->_M_string_length) -
                                   4503599627370496.0)) * 0.0009765625));
  poVar4 = std::operator<<(poVar4,"K");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  Log(this,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x448,local_278[0].Data,false);
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar2 = cmsysProcess_GetState(cp);
  switch(iVar2) {
  case 1:
    std::__cxx11::string::append((char *)output);
    cmsysProcess_GetErrorString(cp);
    std::__cxx11::string::append((char *)output);
    std::__cxx11::string::append((char *)output);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an error: ");
    pcVar6 = cmsysProcess_GetErrorString(cp);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x45e,local_278[0].Data,false);
    break;
  case 2:
    iVar3 = cmsysProcess_GetExitException(cp);
    *retVal = iVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an exception: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*retVal);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x455,local_278[0].Data,false);
    break;
  default:
    goto switchD_00145065_caseD_3;
  case 4:
    iVar3 = cmsysProcess_GetExitValue(cp);
    *retVal = iVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Command exited with the value: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*retVal);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x451,local_278[0].Data,false);
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"There was a timeout");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x457,local_278[0].Data,false);
  }
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
switchD_00145065_caseD_3:
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  cmProcessOutput::~cmProcessOutput(&processOutput);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
LAB_0014529d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return iVar2;
}

Assistant:

int cmCTest::RunMakeCommand(const std::string& command, std::string& output,
                            int* retVal, const char* dir, cmDuration timeout,
                            std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& a : args) {
    argv.push_back(a.c_str());
  }
  argv.push_back(nullptr);

  output.clear();
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  for (char const* arg : argv) {
    if (!arg) {
      break;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << arg << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             "   Each . represents " << tick_len << " bytes of output"
                                     << std::endl
                                     << "    " << std::flush);
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    for (char& cc : strdata) {
      if (cc == 0) {
        cc = '\n';
      }
    }
    output.append(strdata);
    while (output.size() > (tick * tick_len)) {
      tick++;
      cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
      if (tick % tick_line_len == 0 && tick > 0) {
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                   "  Size: " << int((double(output.size()) / 1024.0) + 1)
                              << "K" << std::endl
                              << "    " << std::flush);
      }
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    output.append(strdata);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             " Size of output: " << int(double(output.size()) / 1024.0) << "K"
                                 << std::endl);

  cmsysProcess_WaitForExit(cp, nullptr);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               "Command exited with the value: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Exception) {
    *retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this, WARNING,
               "There was an exception: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  } else if (result == cmsysProcess_State_Error) {
    output += "\n*** ERROR executing: ";
    output += cmsysProcess_GetErrorString(cp);
    output += "\n***The build process failed.";
    cmCTestLog(this, ERROR_MESSAGE,
               "There was an error: " << cmsysProcess_GetErrorString(cp)
                                      << std::endl);
  }

  cmsysProcess_Delete(cp);

  return result;
}